

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21543e::LocalFileSystem::createDirectory(LocalFileSystem *this,string *path)

{
  int iVar1;
  int *piVar2;
  StatStruct statbuf;
  stat sStack_98;
  
  iVar1 = llbuild::basic::sys::mkdir((path->_M_dataplus)._M_p,(__mode_t)path);
  if ((char)iVar1 == '\0') {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      return false;
    }
    iVar1 = llbuild::basic::sys::lstat((path->_M_dataplus)._M_p,&sStack_98);
    if (iVar1 != 0) {
      return false;
    }
    if ((sStack_98.st_mode & 0xf000) != 0x4000) {
      return false;
    }
  }
  return true;
}

Assistant:

virtual bool
  createDirectory(const std::string& path) override {
    if (!llbuild::basic::sys::mkdir(path.c_str())) {
      if (errno != EEXIST) {
        return false;
      }

      // Target exists, check that it is actually a directory
      llbuild::basic::sys::StatStruct statbuf;
      if (llbuild::basic::sys::lstat(path.c_str(), &statbuf) != 0) {
        return false;
      }
      if (!S_ISDIR(statbuf.st_mode)) {
        return false;
      }
    }
    return true;
  }